

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangen.c
# Opt level: O0

int parse_dataoptarg(char *dataoptarg,uchar *rand_position)

{
  size_t sVar1;
  long in_RSI;
  char *in_RDI;
  int i;
  int arglen;
  int mode_format_selected;
  int local_1c;
  int local_14;
  
  local_14 = 2;
  sVar1 = strlen(in_RDI);
  for (local_1c = 0; local_1c < 0x40 && local_1c < (int)sVar1 / 2; local_1c = local_1c + 1) {
    if (*(char *)(_optarg + (local_1c << 1)) == 'x') {
      *(undefined1 *)(_optarg + (local_1c << 1)) = 0x30;
      *(char *)(in_RSI + local_1c) = *(char *)(in_RSI + local_1c) + '\x01';
      local_14 = 5;
    }
    if (*(char *)(_optarg + (local_1c * 2 + 1)) == 'x') {
      *(undefined1 *)(_optarg + (local_1c * 2 + 1)) = 0x30;
      *(char *)(in_RSI + local_1c) = *(char *)(in_RSI + local_1c) + '\x02';
      local_14 = 5;
    }
  }
  return local_14;
}

Assistant:

static int parse_dataoptarg(char *dataoptarg, unsigned char *rand_position)
{
	int mode_format_selected = MODE_FIX;
	int arglen = strlen(dataoptarg);
	int i;

	/* Mark nibbles with * as fuzzable */
	for (i = 0; i < CANFD_MAX_DLEN && i < arglen / 2; i++) {
		if (optarg[2 * i] == CHAR_RANDOM) {
			optarg[2 * i] = '0';
			rand_position[i] += NIBBLE_H;
			mode_format_selected = MODE_RANDOM_FIX;
		}
		if (optarg[2 * i + 1] == CHAR_RANDOM) {
			optarg[2 * i + 1] = '0';
			rand_position[i] += NIBBLE_L;
			mode_format_selected = MODE_RANDOM_FIX;
		}
	}

	return mode_format_selected;
}